

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,capnproto_test::capnp::test::TestUnion::Union3::Which,capnproto_test::capnp::test::TestUnion::Union3::Which>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,Which *params,
          Which *params_1)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  String argValues [2];
  char **ppcVar4;
  undefined8 uVar5;
  Which local_a2;
  char *local_a0;
  char *local_98;
  char **local_90;
  undefined8 uStack_88;
  String local_80;
  char *local_68;
  size_t local_60;
  ArrayDisposer *pAStack_58;
  char *local_50;
  size_t sStack_48;
  ArrayDisposer *pAStack_40;
  
  this->exception = (Exception *)0x0;
  local_a2 = *params;
  local_a0 = condition;
  local_98 = macroArgs;
  str<unsigned_short>(&local_80,&local_a2);
  local_68 = local_80.content.ptr;
  local_60 = local_80.content.size_;
  pAStack_58 = local_80.content.disposer;
  local_a2 = *params_1;
  str<unsigned_short>(&local_80,&local_a2);
  ppcVar4 = &local_68;
  local_50 = local_80.content.ptr;
  sStack_48 = local_80.content.size_;
  pAStack_40 = local_80.content.disposer;
  uStack_88 = 2;
  uVar5 = 2;
  local_90 = ppcVar4;
  init(this,(EVP_PKEY_CTX *)file);
  lVar3 = 0x18;
  do {
    lVar1 = *(long *)((long)&local_68 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_60 + lVar3);
      *(undefined8 *)((long)&local_68 + lVar3) = 0;
      *(undefined8 *)((long)&local_60 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&pAStack_58 + lVar3))
                (*(undefined8 **)((long)&pAStack_58 + lVar3),lVar1,1,uVar2,uVar2,0,ppcVar4,uVar5);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}